

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprParseUnbalanced
              (sqlite3_tokenizer *pTokenizer,int iLangid,char **azCol,int bFts4,int nCol,
              int iDefaultCol,char *z,int n,Fts3Expr **ppExpr)

{
  size_t sVar1;
  undefined1 local_78 [8];
  ParseContext sParse;
  int local_38;
  int rc;
  int nParsed;
  int iDefaultCol_local;
  int nCol_local;
  int bFts4_local;
  char **azCol_local;
  sqlite3_tokenizer *psStack_18;
  int iLangid_local;
  sqlite3_tokenizer *pTokenizer_local;
  
  rc = iDefaultCol;
  nParsed = nCol;
  iDefaultCol_local = bFts4;
  _nCol_local = azCol;
  azCol_local._4_4_ = iLangid;
  psStack_18 = pTokenizer;
  memset(local_78,0,0x38);
  local_78 = (undefined1  [8])psStack_18;
  sParse.pTokenizer._0_4_ = azCol_local._4_4_;
  sParse._8_8_ = _nCol_local;
  sParse.azCol._4_4_ = nParsed;
  sParse.bFts4 = rc;
  sParse.azCol._0_4_ = iDefaultCol_local;
  if (z == (char *)0x0) {
    *ppExpr = (Fts3Expr *)0x0;
    pTokenizer_local._4_4_ = 0;
  }
  else {
    if (n < 0) {
      sVar1 = strlen(z);
      n = (int)sVar1;
    }
    sParse._52_4_ = fts3ExprParse((ParseContext *)local_78,z,n,ppExpr,&local_38);
    if ((sParse._52_4_ == 0) && ((int)sParse.pCtx != 0)) {
      sParse._52_4_ = 1;
    }
    pTokenizer_local._4_4_ = sParse._52_4_;
  }
  return pTokenizer_local._4_4_;
}

Assistant:

static int fts3ExprParseUnbalanced(
  sqlite3_tokenizer *pTokenizer,      /* Tokenizer module */
  int iLangid,                        /* Language id for tokenizer */
  char **azCol,                       /* Array of column names for fts3 table */
  int bFts4,                          /* True to allow FTS4-only syntax */
  int nCol,                           /* Number of entries in azCol[] */
  int iDefaultCol,                    /* Default column to query */
  const char *z, int n,               /* Text of MATCH query */
  Fts3Expr **ppExpr                   /* OUT: Parsed query structure */
){
  int nParsed;
  int rc;
  ParseContext sParse;

  memset(&sParse, 0, sizeof(ParseContext));
  sParse.pTokenizer = pTokenizer;
  sParse.iLangid = iLangid;
  sParse.azCol = (const char **)azCol;
  sParse.nCol = nCol;
  sParse.iDefaultCol = iDefaultCol;
  sParse.bFts4 = bFts4;
  if( z==0 ){
    *ppExpr = 0;
    return SQLITE_OK;
  }
  if( n<0 ){
    n = (int)strlen(z);
  }
  rc = fts3ExprParse(&sParse, z, n, ppExpr, &nParsed);
  assert( rc==SQLITE_OK || *ppExpr==0 );

  /* Check for mismatched parenthesis */
  if( rc==SQLITE_OK && sParse.nNest ){
    rc = SQLITE_ERROR;
  }
  
  return rc;
}